

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O2

size_t __thiscall RelocBlockWrapper::maxEntriesNumInBlock(RelocBlockWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar5;
  size_t sVar6;
  long lVar4;
  
  sVar6 = this->cachedMaxNum;
  if (sVar6 == 0) {
    iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0xc])();
    if (CONCAT44(extraout_var,iVar2) == 0) {
      sVar6 = 0;
    }
    else {
      iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x13])(this,2,0xffffffffffffffff);
      iVar3 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x14])(this,2,0xffffffffffffffff);
      lVar4 = CONCAT44(extraout_var_01,iVar3);
      iVar3 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->
                super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xd])();
      uVar5 = CONCAT44(extraout_var_02,iVar3) - lVar4;
      if (lVar4 + CONCAT44(extraout_var_00,iVar2) <= CONCAT44(extraout_var_02,iVar3)) {
        uVar5 = CONCAT44(extraout_var_00,iVar2);
      }
      pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
      iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar1,lVar4,1,uVar5,0);
      sVar6 = uVar5 >> 1;
      if (CONCAT44(extraout_var_03,iVar2) == 0) {
        sVar6 = 0;
      }
      this->cachedMaxNum = sVar6;
    }
  }
  return sVar6;
}

Assistant:

size_t RelocBlockWrapper::maxEntriesNumInBlock()
{
    if (this->cachedMaxNum > 0) return this->cachedMaxNum;

    IMAGE_BASE_RELOCATION* reloc = (IMAGE_BASE_RELOCATION*) this->getPtr();
    if (!reloc) return 0;

    bufsize_t entriesSize = getFieldSize(ENTRIES_PTR);
    offset_t entriesOffset = getFieldOffset(ENTRIES_PTR);

    offset_t fileSize = m_Exe->getRawSize();
    if (entriesOffset + entriesSize > fileSize) {
        entriesSize = fileSize - entriesOffset; // truncate to fileSize
    }

    void *ptr = this->m_Exe->getContentAt(entriesOffset, Executable::RAW, entriesSize);

    bufsize_t entriesNum = 0;
    if (ptr) {
        entriesNum = entriesSize / sizeof(WORD); //sizeof(BASE_RELOCATION_ENTRY);
    }
    this->cachedMaxNum = entriesNum;
    return entriesNum;
}